

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubQuit0(Abc_Obj_t *pRoot,Abc_Obj_t *pObj)

{
  Dec_Edge_t eRoot_00;
  Dec_Graph_t *pGraph_00;
  Dec_Node_t *pDVar1;
  Dec_Edge_t eRoot;
  Dec_Graph_t *pGraph;
  Abc_Obj_t *pObj_local;
  Abc_Obj_t *pRoot_local;
  
  pGraph_00 = Dec_GraphCreate(1);
  pDVar1 = Dec_GraphNode(pGraph_00,0);
  (pDVar1->field_2).pFunc = pObj;
  eRoot_00 = Dec_EdgeCreate(0,*(uint *)&pObj->field_0x14 >> 7 & 1);
  Dec_GraphSetRoot(pGraph_00,eRoot_00);
  if ((*(uint *)&pRoot->field_0x14 >> 7 & 1) != 0) {
    Dec_GraphComplement(pGraph_00);
  }
  return pGraph_00;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit0( Abc_Obj_t * pRoot, Abc_Obj_t * pObj )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot;
    pGraph = Dec_GraphCreate( 1 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj;
    eRoot = Dec_EdgeCreate( 0, pObj->fPhase );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}